

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

int __thiscall gvr::PLYWriter::close(PLYWriter *this,int __fd)

{
  pointer ppPVar1;
  PLYElement *pPVar2;
  ulong uVar3;
  IOException *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  allocator local_39;
  string local_38;
  
  if (this->header_complete == false) {
    writeHeader(this);
  }
  uVar3 = std::__basic_file<char>::is_open();
  if ((char)uVar3 != '\0') {
    std::ofstream::close();
    ppPVar1 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    uVar4 = this->pelem + 1;
    uVar5 = uVar4;
    if (uVar4 < uVar3) {
      uVar5 = uVar3;
    }
    while ((uVar6 = uVar5, uVar4 < uVar3 &&
           ((pPVar2 = ppPVar1[uVar4], pPVar2->size < 1 ||
            (uVar6 = uVar4,
            (int)((ulong)((long)*(pointer *)
                                 ((long)&(pPVar2->list).
                                         super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                         ._M_impl + 8) -
                         *(long *)&(pPVar2->list).
                                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                   ._M_impl.super__Vector_impl_data) >> 6) == 0))))) {
      uVar4 = uVar4 + 1;
    }
    this->pelem = uVar6;
    if ((((uVar4 < uVar3) || (this->plist != 0)) || (this->pprop != 1)) || (this->pinst != 1)) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,
                 "All data as specified in the header must be written. The ply file is corrupted!",
                 &local_39);
      gutil::IOException::IOException(this_00,&local_38);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
  }
  return (int)uVar3;
}

Assistant:

void PLYWriter::close()
{
  if (!header_complete)
  {
    writeHeader();
  }

  if (out.is_open())
  {
    out.close();

    pelem++;

    while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                   list[pelem]->getPropertyCount() == 0))
    {
      pelem++;
    }

    if (!(plist == 0 && pprop == 1 && pinst == 1 && pelem >= list.size()))
    {
      throw gutil::IOException("All data as specified in the header must be written. The ply file is corrupted!");
    }
  }
}